

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix33<double> * __thiscall Imath_3_2::Matrix33<double>::transpose(Matrix33<double> *this)

{
  Matrix33<double> *in_RDI;
  Matrix33<double> tmp;
  Matrix33<double> local_50;
  
  Matrix33(&local_50,in_RDI->x[0][0],in_RDI->x[1][0],in_RDI->x[2][0],in_RDI->x[0][1],in_RDI->x[1][1]
           ,in_RDI->x[2][1],in_RDI->x[0][2],in_RDI->x[1][2],in_RDI->x[2][2]);
  operator=(in_RDI,&local_50);
  return in_RDI;
}

Assistant:

const Matrix33<T>&
                 Matrix33<T>::transpose () IMATH_NOEXCEPT
{
    Matrix33 tmp (
        x[0][0],
        x[1][0],
        x[2][0],
        x[0][1],
        x[1][1],
        x[2][1],
        x[0][2],
        x[1][2],
        x[2][2]);
    *this = tmp;
    return *this;
}